

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

bool duckdb::ApproxQuantileCoding::Decode<double,signed_char>(double *source,char *target)

{
  bool bVar1;
  
  bVar1 = TryCast::Operation<double,signed_char>(*source,target,false);
  if (!bVar1) {
    *target = (*source <= 0.0 && *source != 0.0) + '\x7f';
  }
  return bVar1;
}

Assistant:

static bool Decode(const SAVE_TYPE &source, TARGET_TYPE &target) {
		// The result is approximate, so clamp instead of overflowing.
		if (TryCast::Operation(source, target, false)) {
			return true;
		} else if (source < 0) {
			target = NumericLimits<TARGET_TYPE>::Minimum();
		} else {
			target = NumericLimits<TARGET_TYPE>::Maximum();
		}
		return false;
	}